

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator>
               (iterator *value,ostream *os)

{
  ostream *os_local;
  iterator *value_local;
  
  RawBytesPrinter::
  PrintValue<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator,8ul>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}